

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::BufferMapReadCase::iterate(BufferMapReadCase *this)

{
  CallLogWrapper *this_00;
  TestLog *log;
  bool bVar1;
  deUint32 dVar2;
  GLenum GVar3;
  deUint8 *resPtr;
  TestError *this_01;
  char *description;
  BufferWriter writer;
  ReferenceBuffer refBuf;
  BufferWriter local_50;
  ReferenceBuffer local_48;
  
  log = ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar2 = deStringHash((this->super_BufferCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                       _M_p);
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (deUint8 *)0x0;
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::BufferTestUtil::BufferWriter::BufferWriter
            (&local_50,(this->super_BufferCase).m_renderCtx,
             ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log,this->m_write
            );
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(&local_48,this->m_bufferSize);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,this->m_bufferSize,dVar2);
  dVar2 = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,dVar2);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_bufferTarget,(long)this->m_bufferSize,(void *)0x0,this->m_usage);
  deqp::gls::BufferTestUtil::BufferWriter::write
            (&local_50,dVar2,(void *)0x0,(ulong)(uint)this->m_bufferSize);
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,dVar2);
  resPtr = (deUint8 *)
           glu::CallLogWrapper::glMapBufferRange
                     (this_00,this->m_bufferTarget,(long)this->m_mapOffset,(long)this->m_mapSize,1);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0x53);
  if (resPtr != (deUint8 *)0x0) {
    bVar1 = deqp::gls::BufferTestUtil::compareByteArrays
                      (log,resPtr,
                       local_48.m_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + this->m_mapOffset,this->m_mapSize);
    glu::CallLogWrapper::glUnmapBuffer(this_00,this->m_bufferTarget);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar3,"glUnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                    ,0x59);
    deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,dVar2);
    description = "Buffer verification failed";
    if (bVar1) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,
               description);
    deqp::gls::BufferTestUtil::BufferWriter::~BufferWriter(&local_50);
    if (local_48.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (deUint8 *)0x0) {
      operator_delete(local_48.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0x54);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&		log			= m_testCtx.getLog();
		deUint32		dataSeed	= deStringHash(getName());
		ReferenceBuffer	refBuf;
		BufferWriter	writer		(m_renderCtx, m_testCtx.getLog(), m_write);
		bool			isOk		= false;

		// Setup reference data.
		refBuf.setSize(m_bufferSize);
		fillWithRandomBytes(refBuf.getPtr(), m_bufferSize, dataSeed);

		deUint32 buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, m_bufferSize, DE_NULL, m_usage);
		writer.write(buf, 0, m_bufferSize, refBuf.getPtr(), m_bufferTarget);

		glBindBuffer(m_bufferTarget, buf);
		void* ptr = glMapBufferRange(m_bufferTarget, m_mapOffset, m_mapSize, GL_MAP_READ_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		isOk = compareByteArrays(log, (const deUint8*)ptr, refBuf.getPtr(m_mapOffset), m_mapSize);

		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}